

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O2

size_t __thiscall
Common::BijectionMap<std::__cxx11::string,ICM::Keyword::KeywordID>::_find<std::__cxx11::string>
          (BijectionMap<std::__cxx11::string,ICM::Keyword::KeywordID> *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *map,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  const_iterator cVar1;
  size_t sVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&map->_M_t,v);
  if ((_Rb_tree_header *)cVar1._M_node == &(map->_M_t)._M_impl.super__Rb_tree_header) {
    sVar2 = (*(long *)(this + 0x70) - *(long *)(this + 0x68)) / 0x28;
  }
  else {
    sVar2 = *(size_t *)(cVar1._M_node + 2);
  }
  return sVar2;
}

Assistant:

size_t _find(const std::map<T, size_t> &map, const T &v) const {
		auto iter = map.find(v);
		if (iter != map.end())
			return iter->second;
		else
			return this->size();
	}